

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * __thiscall Catch::TagInfo::all_abi_cxx11_(string *__return_storage_ptr__,TagInfo *this)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  
  p_Var1 = &(this->spellings)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var2 = (this->spellings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != p_Var1;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2)) {
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (p_Var2 = (this->spellings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != p_Var1;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2)) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*(ulong *)(p_Var2 + 1));
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TagInfo::all() const {
        size_t size = 0;
        for (auto const& spelling : spellings) {
            // Add 2 for the brackes
            size += spelling.size() + 2;
        }

        std::string out; out.reserve(size);
        for (auto const& spelling : spellings) {
            out += '[';
            out += spelling;
            out += ']';
        }
        return out;
    }